

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::emsg::parse(emsg *this,char *ptr,uint data_size)

{
  uint32_t uVar1;
  char *pcVar2;
  long lVar3;
  uint64_t uVar4;
  value_type_conflict local_d9;
  uint local_d8;
  allocator local_d1;
  uint i;
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  uint64_t local_28;
  uint64_t offset;
  char *pcStack_18;
  uint data_size_local;
  char *ptr_local;
  emsg *this_local;
  
  offset._4_4_ = data_size;
  pcStack_18 = ptr;
  ptr_local = (char *)this;
  full_box::parse(&this->super_full_box,ptr);
  local_28 = full_box::size(&this->super_full_box);
  if ((this->super_full_box).super_box.field_0x62 == '\0') {
    pcVar2 = pcStack_18 + local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar2,&local_49);
    std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    uVar4 = local_28;
    lVar3 = std::__cxx11::string::size();
    local_28 = uVar4 + 1 + lVar3;
    pcVar2 = pcStack_18 + local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar2,&local_81);
    std::__cxx11::string::operator=((string *)&this->value_,local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    uVar4 = local_28;
    lVar3 = std::__cxx11::string::size();
    local_28 = uVar4 + lVar3 + 1;
    uVar1 = anon_unknown.dwarf_2d70b::fmp4_read_uint32(pcStack_18 + local_28);
    this->timescale_ = uVar1;
    local_28 = local_28 + 4;
    uVar1 = anon_unknown.dwarf_2d70b::fmp4_read_uint32(pcStack_18 + local_28);
    this->presentation_time_delta_ = uVar1;
    local_28 = local_28 + 4;
    uVar1 = anon_unknown.dwarf_2d70b::fmp4_read_uint32(pcStack_18 + local_28);
    this->event_duration_ = uVar1;
    local_28 = local_28 + 4;
    uVar1 = anon_unknown.dwarf_2d70b::fmp4_read_uint32(pcStack_18 + local_28);
    this->id_ = uVar1;
    local_28 = local_28 + 4;
  }
  else {
    uVar1 = anon_unknown.dwarf_2d70b::fmp4_read_uint32(pcStack_18 + local_28);
    this->timescale_ = uVar1;
    local_28 = local_28 + 4;
    uVar4 = anon_unknown.dwarf_2d70b::fmp4_read_uint64(pcStack_18 + local_28);
    this->presentation_time_ = uVar4;
    local_28 = local_28 + 8;
    uVar1 = anon_unknown.dwarf_2d70b::fmp4_read_uint32(pcStack_18 + local_28);
    this->event_duration_ = uVar1;
    local_28 = local_28 + 4;
    uVar1 = anon_unknown.dwarf_2d70b::fmp4_read_uint32(pcStack_18 + local_28);
    this->id_ = uVar1;
    local_28 = local_28 + 4;
    pcVar2 = pcStack_18 + local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar2,&local_a9);
    std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    uVar4 = local_28;
    lVar3 = std::__cxx11::string::size();
    local_28 = uVar4 + 1 + lVar3;
    pcVar2 = pcStack_18 + local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i,pcVar2,&local_d1);
    std::__cxx11::string::operator=((string *)&this->value_,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    uVar4 = local_28;
    lVar3 = std::__cxx11::string::size();
    local_28 = uVar4 + lVar3 + 1;
  }
  for (local_d8 = (uint)local_28; local_d8 < offset._4_4_; local_d8 = local_d8 + 1) {
    local_d9 = pcStack_18[local_d8];
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->message_data_,&local_d9);
  }
  return;
}

Assistant:

void emsg::parse(const char *ptr, unsigned int data_size)
	{
		full_box::parse(ptr);
		uint64_t offset = full_box::size();
		if (version_ == 0)
		{
			scheme_id_uri_ = std::string(ptr + offset);
			//cout << "scheme_id_uri: " << scheme_id_uri << endl;
			offset = offset + scheme_id_uri_.size() + 1;
			value_ = std::string(ptr + offset);
			//cout << "value: " << value << endl;
			offset = offset + value_.size() + 1;
			timescale_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
			//cout << "timescale: " << timescale << endl;
			presentation_time_delta_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
			//cout << "presentation_time_delta: " << presentation_time_delta << endl;
			event_duration_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
			//cout << "event_duration: " << event_duration << endl;
			id_ = fmp4_read_uint32(ptr + offset);
			//cout << "id: " << id << endl;
			offset += 4;
		}
		else
		{
			timescale_ = fmp4_read_uint32(ptr + offset);
			//cout << "timescale: " << timescale << endl;
			offset += 4;
			presentation_time_ = fmp4_read_uint64(ptr + offset);
			//cout << "presentation time: " << presentation_time << endl;
			offset += 8;
			event_duration_ = fmp4_read_uint32(ptr + offset);
			//cout << "event duration: " << event_duration << endl;
			offset += 4;
			id_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
			//cout << "id: " << id << endl;
			scheme_id_uri_ = std::string(ptr + offset);
			offset = offset + scheme_id_uri_.size() + 1;
			//cout << "scheme_id_uri: " << scheme_id_uri << endl;
			value_ = std::string(ptr + offset);
			//cout << "value: " << value << endl;
			offset = offset + value_.size() + 1;
		}
		for (unsigned int i = (unsigned int)offset; i < data_size; i++)
		{
			message_data_.push_back(*(ptr + (size_t)i));
		}
	}